

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkAbsCreateFlopInputs
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Wlc_Obj_t *pCounter,int AdderBits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Wlc_Obj_t *pObj_00;
  Wlc_Obj_t *p_00;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pObj_01;
  Wlc_Obj_t *local_b0;
  Wlc_Obj_t *local_a8;
  int iFrame;
  int iObj;
  int Value;
  int Entry;
  int n;
  int i;
  Wlc_Obj_t *pConst;
  Wlc_Obj_t *pMux;
  Wlc_Obj_t *pCond;
  Wlc_Obj_t *pFlop;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pCounter_local;
  Vec_Int_t *vNewObjs_local;
  Vec_Int_t *vFanins_local;
  Vec_Int_t *vNodeFrames_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  Entry = 0;
  do {
    iVar1 = Vec_IntSize(vNodeFrames);
    if (iVar1 <= Entry) {
      return;
    }
    uVar2 = Vec_IntEntry(vNodeFrames,Entry);
    pObj_00 = Wlc_NtkObj(p,(int)uVar2 >> 0xb);
    for (Value = 0; Value < 2; Value = Value + 1) {
      iVar1 = Vec_IntEntry(vNewObjs,Entry * 2 + Value);
      p_00 = Wlc_NtkObj(pNew,iVar1);
      iVar1 = Wlc_ObjType(pObj_00);
      if (iVar1 == 0x37) {
        if (Value == 0) {
          local_a8 = Wlc_ObjFanin1(p,pObj_00);
        }
        else {
          local_a8 = Wlc_ObjFanin2(p,pObj_00);
        }
        pFlop = Wlc_ObjCopyObj(pNew,p,local_a8);
LAB_003f123a:
        iVar1 = Wlc_ObjRange(p_00);
        iVar3 = Wlc_ObjRange(pFlop);
        if (iVar1 != iVar3) {
          __assert_fail("Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x184,
                        "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                       );
        }
        iVar1 = Wlc_ObjAlloc(pNew,6,0,AdderBits + -1,0);
        pWVar4 = Wlc_NtkObj(pNew,iVar1);
        Vec_IntFill(vFanins,1,(int)uVar2 >> 1 & 0x3ff);
        Wlc_ObjAddFanins(pNew,pWVar4,vFanins);
        iVar1 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
        pObj_01 = Wlc_NtkObj(pNew,iVar1);
        iVar1 = Wlc_ObjId(pNew,pWVar4);
        iVar3 = Wlc_ObjId(pNew,pCounter);
        Vec_IntFillTwo(vFanins,2,iVar1,iVar3);
        Wlc_ObjAddFanins(pNew,pObj_01,vFanins);
        iVar1 = Wlc_ObjRange(p_00);
        iVar1 = Wlc_ObjAlloc(pNew,8,0,iVar1 + -1,0);
        pWVar4 = Wlc_NtkObj(pNew,iVar1);
        Vec_IntClear(vFanins);
        iVar1 = Wlc_ObjId(pNew,pObj_01);
        Vec_IntPush(vFanins,iVar1);
        iVar1 = Wlc_ObjId(pNew,p_00);
        Vec_IntPush(vFanins,iVar1);
        iVar1 = Wlc_ObjId(pNew,pFlop);
        Vec_IntPush(vFanins,iVar1);
        Wlc_ObjAddFanins(pNew,pWVar4,vFanins);
        Wlc_ObjSetCo(pNew,pWVar4,1);
      }
      else {
        iVar1 = Wlc_ObjType(pObj_00);
        if (iVar1 == 0x36) {
          if (Value == 0) {
            pWVar4 = Wlc_ObjFanin1(p,pObj_00);
            local_b0 = Wlc_ObjCopyObj(pNew,p,pWVar4);
          }
          else {
            iVar1 = Wlc_ObjCopy(p,(int)uVar2 >> 0xb);
            local_b0 = Wlc_NtkObj(pNew,iVar1);
          }
          pFlop = local_b0;
          goto LAB_003f123a;
        }
        iVar1 = Wlc_ObjType(pObj_00);
        if (iVar1 != 8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x183,
                        "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                       );
        }
        if (Value == 0) {
          pWVar4 = Wlc_ObjFanin0(p,pObj_00);
          pFlop = Wlc_ObjCopyObj(pNew,p,pWVar4);
          if ((uVar2 & 1) != 0) {
            iVar1 = Wlc_ObjId(pNew,pFlop);
            Vec_IntFill(vFanins,1,iVar1);
            iVar1 = Wlc_ObjAlloc(pNew,0xf,0,0,0);
            pFlop = Wlc_NtkObj(pNew,iVar1);
            Wlc_ObjAddFanins(pNew,pFlop,vFanins);
          }
          goto LAB_003f123a;
        }
      }
    }
    Entry = Entry + 1;
  } while( true );
}

Assistant:

void Wlc_NtkAbsCreateFlopInputs( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Wlc_Obj_t * pCounter, int AdderBits ) 
{
    Wlc_Obj_t * pObj, * pFanin, * pFlop, * pCond, * pMux, * pConst;
    int i, n, Entry, Value, iObj, iFrame;
    Vec_IntForEachEntry( vNodeFrames, Entry, i )
    {
        Value  = Entry & 1;
        iObj   = Entry >> 11;
        iFrame = (Entry >> 1) & 0x3FF;
        pObj   = Wlc_NtkObj( p, iObj );
        for ( n = 0; n < 2; n++ ) // n=0 -- address   n=1 -- data
        {
            pFlop = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*i+n) );
            if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
                pFanin = Wlc_ObjCopyObj( pNew, p, n ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
                pFanin = n ? Wlc_NtkObj(pNew, Wlc_ObjCopy(p, iObj)) : Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            {
                if ( n ) continue;
                pFanin = Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin0(p, pObj) );
                if ( Value )
                {
                    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pFanin) );
                    pFanin = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_NOT, 0, 0, 0));
                    Wlc_ObjAddFanins( pNew, pFanin, vFanins );
                }
            }
            else assert( 0 );
            assert( Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin) );
            // create constant
            pConst = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, AdderBits-1, 0));
            Vec_IntFill( vFanins, 1, iFrame );
            Wlc_ObjAddFanins( pNew, pConst, vFanins );
            // create equality
            pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
            Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pConst), Wlc_ObjId(pNew, pCounter) );
            Wlc_ObjAddFanins( pNew, pCond, vFanins );
            // create MUX
            pMux = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pFlop)-1, 0));
            Vec_IntClear( vFanins );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pCond) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFlop) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFanin) );
            Wlc_ObjAddFanins( pNew, pMux, vFanins );
            Wlc_ObjSetCo( pNew, pMux, 1 );
        }
    }
}